

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::concat<kj::StringTree,kj::StringTree,kj::StringTree>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          StringTree *params_1,StringTree *params_2)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  size_t result_2;
  String local_68;
  long local_48 [4];
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_68.content.ptr = (char *)this->size_;
  local_68.content.size_ = params->size_;
  local_68.content.disposer = (ArrayDisposer *)params_1->size_;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_68.content.ptr + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  __return_storage_ptr__->size_ = sVar3;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_48 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  heapString(&local_68,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_68.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_68.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_68.content.disposer;
  local_48[0] = 1;
  local_48[1] = 1;
  local_48[2] = 1;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_48 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  local_68.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_68.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_68.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_68.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_68.content.size_;
  (__return_storage_ptr__->branches).disposer = local_68.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::StringTree>(__return_storage_ptr__,pcVar5,0,this,params,params_1);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}